

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIFileOpenDialog::CGUIFileOpenDialog
          (CGUIFileOpenDialog *this,wchar_t *title,IGUIEnvironment *environment,IGUIElement *parent,
          s32 id,bool restoreCWD,char_type *startDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  vector2d<int> vVar3;
  vector2d<int> vVar4;
  _func_int **pp_Var5;
  long *plVar6;
  uint uVar7;
  IFileSystem *pIVar8;
  undefined4 extraout_var;
  long *plVar9;
  long lVar10;
  wchar_t *pwVar11;
  IGUIButton *pIVar12;
  IGUIListBox *pIVar13;
  IGUIEditBox *pIVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  string<char> local_50;
  
  *(undefined ***)&this->field_0x268 = &PTR__IReferenceCounted_0025f7e0;
  *(undefined8 *)&this->field_0x270 = 0;
  *(undefined4 *)&this->field_0x278 = 1;
  vVar3 = (parent->AbsoluteRect).UpperLeftCorner;
  vVar4 = (parent->AbsoluteRect).LowerRightCorner;
  iVar17 = vVar4.X - vVar3.X;
  local_50.str._M_dataplus._M_p._0_4_ = (iVar17 - (iVar17 + -0x15e >> 0x1f)) + -0x15e >> 1;
  iVar17 = vVar4.Y - vVar3.Y;
  local_50.str._M_dataplus._M_p._4_4_ = (iVar17 - (iVar17 + -0xfa >> 0x1f)) + -0xfa >> 1;
  local_50.str._M_string_length =
       CONCAT44(local_50.str._M_dataplus._M_p._4_4_ + 0xfa,
                (int)local_50.str._M_dataplus._M_p + 0x15e);
  IGUIElement::IGUIElement
            ((IGUIElement *)this,&PTR_construction_vtable_24__0026e5c0,EGUIET_FILE_OPEN_DIALOG,
             environment,parent,id,(rect<int> *)&local_50);
  *(undefined8 *)this = 0x26e448;
  *(undefined8 *)&this->field_0x268 = 0x26e5a0;
  (this->DragStart).X = 0;
  (this->DragStart).Y = 0;
  (this->FileName).str._M_dataplus._M_p = (pointer)&(this->FileName).str.field_2;
  (this->FileName).str._M_string_length = 0;
  (this->FileName).str.field_2._M_local_buf[0] = '\0';
  (this->FileNameW).str._M_dataplus._M_p = (pointer)&(this->FileNameW).str.field_2;
  (this->FileNameW).str._M_string_length = 0;
  (this->FileNameW).str.field_2._M_local_buf[0] = L'\0';
  (this->FileDirectory).str._M_dataplus._M_p = (pointer)&(this->FileDirectory).str.field_2;
  (this->FileDirectory).str._M_string_length = 0;
  (this->FileDirectory).str.field_2._M_local_buf[0] = '\0';
  (this->FileDirectoryFlat).str._M_dataplus._M_p = (pointer)&(this->FileDirectoryFlat).str.field_2;
  (this->FileDirectoryFlat).str._M_string_length = 0;
  (this->FileDirectoryFlat).str.field_2._M_local_buf[0] = '\0';
  (this->FileDirectoryFlatW).str._M_dataplus._M_p = (pointer)&(this->FileDirectoryFlatW).str.field_2
  ;
  (this->FileDirectoryFlatW).str._M_string_length = 0;
  (this->FileDirectoryFlatW).str.field_2._M_local_buf[0] = L'\0';
  (this->RestoreDirectory).str._M_dataplus._M_p = (pointer)&(this->RestoreDirectory).str.field_2;
  (this->RestoreDirectory).str._M_string_length = 0;
  (this->RestoreDirectory).str.field_2._M_local_buf[0] = '\0';
  (this->StartDirectory).str._M_dataplus._M_p = (pointer)&(this->StartDirectory).str.field_2;
  (this->StartDirectory).str._M_string_length = 0;
  (this->StartDirectory).str.field_2._M_local_buf[0] = '\0';
  this->FileNameText = (IGUIEditBox *)0x0;
  this->FileList = (IFileList *)0x0;
  this->Dragging = false;
  core::string<wchar_t>::operator=((string<wchar_t> *)&this->field_0xa8,title);
  if (*(long **)&this->field_0x128 == (long *)0x0) {
    this->FileSystem = (IFileSystem *)0x0;
  }
  else {
    pIVar8 = (IFileSystem *)(**(code **)(**(long **)&this->field_0x128 + 0x38))();
    this->FileSystem = pIVar8;
    if (pIVar8 != (IFileSystem *)0x0) {
      pp_Var5 = pIVar8->_vptr_IFileSystem;
      *(int *)(&pIVar8->field_0x10 + (long)pp_Var5[-3]) =
           *(int *)(&pIVar8->field_0x10 + (long)pp_Var5[-3]) + 1;
      if (restoreCWD) {
        iVar17 = (*pp_Var5[0x11])(pIVar8);
        if (&this->RestoreDirectory != (path *)CONCAT44(extraout_var,iVar17)) {
          ::std::__cxx11::string::_M_assign((string *)&this->RestoreDirectory);
        }
      }
      if (startDir != (char_type *)0x0) {
        core::string<char>::operator=(&this->StartDirectory,startDir);
        pIVar8 = this->FileSystem;
        paVar1 = &local_50.str.field_2;
        local_50.str._M_string_length._0_4_ = 0;
        local_50.str._M_string_length._4_4_ = 0;
        local_50.str.field_2._M_local_buf[0] = '\0';
        local_50.str._M_dataplus._M_p = (pointer)paVar1;
        core::string<char>::operator=(&local_50,startDir);
        (*pIVar8->_vptr_IFileSystem[0x12])(pIVar8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_50.str._M_dataplus._M_p,
                          CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                                   local_50.str.field_2._M_local_buf[0]) + 1);
        }
      }
      plVar9 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
      if (plVar9 == (long *)0x0) {
        iVar17 = 2;
        uVar16 = 0xffffffff;
        lVar10 = 0;
      }
      else {
        lVar10 = (**(code **)(*plVar9 + 0x40))(plVar9);
        uVar7 = (**(code **)*plVar9)(plVar9,0x12);
        uVar16 = (ulong)uVar7;
        iVar17 = (**(code **)(*plVar9 + 0x10))(plVar9,2);
      }
      iVar15 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      plVar6 = *(long **)&this->field_0x128;
      local_50.str._M_dataplus._M_p._4_4_ = 3;
      local_50.str._M_dataplus._M_p._0_4_ = (iVar15 - iVar17) + -4;
      local_50.str._M_string_length = CONCAT44(iVar17 + 3,iVar15 + -4);
      if (plVar9 == (long *)0x0) {
        pwVar11 = L"Close";
      }
      else {
        pwVar11 = (wchar_t *)(**(code **)(*plVar9 + 0x18))(plVar9,4);
      }
      pIVar12 = (IGUIButton *)
                (**(code **)(*plVar6 + 0xb8))(plVar6,&local_50,this,0xffffffff,L"",pwVar11);
      this->CloseButton = pIVar12;
      (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar12,1);
      pIVar12 = this->CloseButton;
      (pIVar12->super_IGUIElement).IsTabStop = false;
      if ((plVar9 != (long *)0x0) && (lVar10 != 0)) {
        (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
                  (pIVar12,lVar10);
        pIVar12 = this->CloseButton;
        uVar7 = (**(code **)(*plVar9 + 0x50))(plVar9,2);
        (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                  (pIVar12,0,(ulong)uVar7,uVar16,0,0);
        pIVar12 = this->CloseButton;
        uVar7 = (**(code **)(*plVar9 + 0x50))(plVar9,2);
        (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                  (pIVar12,1,(ulong)uVar7,uVar16,0,0);
        pIVar12 = this->CloseButton;
      }
      (pIVar12->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
      (pIVar12->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
      pcVar2 = (pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8 +
               (long)&(pIVar12->super_IGUIElement).Children.
                      super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar2 = *(int *)pcVar2 + 1;
      iVar17 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      plVar6 = *(long **)&this->field_0x128;
      local_50.str._M_dataplus._M_p._4_4_ = 0x1e;
      local_50.str._M_dataplus._M_p._0_4_ = iVar17 + -0x50;
      local_50.str._M_string_length = CONCAT44(0x32,iVar17 + -10);
      if (plVar9 == (long *)0x0) {
        pwVar11 = L"OK";
      }
      else {
        pwVar11 = (wchar_t *)(**(code **)(*plVar9 + 0x18))(plVar9,0);
      }
      pIVar12 = (IGUIButton *)
                (**(code **)(*plVar6 + 0xb8))(plVar6,&local_50,this,0xffffffff,pwVar11,0);
      this->OKButton = pIVar12;
      (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar12,1);
      pIVar12 = this->OKButton;
      (pIVar12->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
      (pIVar12->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
      pcVar2 = (pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8 +
               (long)&(pIVar12->super_IGUIElement).Children.
                      super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar2 = *(int *)pcVar2 + 1;
      iVar17 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      plVar6 = *(long **)&this->field_0x128;
      local_50.str._M_dataplus._M_p._4_4_ = 0x37;
      local_50.str._M_dataplus._M_p._0_4_ = iVar17 + -0x50;
      local_50.str._M_string_length = CONCAT44(0x4b,iVar17 + -10);
      if (plVar9 == (long *)0x0) {
        pwVar11 = L"Cancel";
      }
      else {
        pwVar11 = (wchar_t *)(**(code **)(*plVar9 + 0x18))(plVar9,1);
      }
      pIVar12 = (IGUIButton *)
                (**(code **)(*plVar6 + 0xb8))(plVar6,&local_50,this,0xffffffff,pwVar11,0);
      this->CancelButton = pIVar12;
      (*(pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar12,1);
      pIVar12 = this->CancelButton;
      (pIVar12->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
      (pIVar12->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
      (pIVar12->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
      pcVar2 = (pIVar12->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8 +
               (long)&(pIVar12->super_IGUIElement).Children.
                      super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar2 = *(int *)pcVar2 + 1;
      local_50.str._M_dataplus._M_p = (pointer)0x370000000a;
      local_50.str._M_string_length =
           CONCAT44(0xe6,(*(int *)&this->field_0x38 - *(int *)&this->field_0x30) + -0x5a);
      pIVar13 = (IGUIListBox *)
                (**(code **)(**(long **)&this->field_0x128 + 0xe0))
                          (*(long **)&this->field_0x128,&local_50,this,0xffffffff,1);
      this->FileBox = pIVar13;
      (*(pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar13,1);
      pIVar13 = this->FileBox;
      (pIVar13->super_IGUIElement).AlignLeft = EGUIA_UPPERLEFT;
      (pIVar13->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
      (pIVar13->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
      (pIVar13->super_IGUIElement).AlignBottom = EGUIA_LOWERRIGHT;
      pcVar2 = (pIVar13->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8 +
               (long)&(pIVar13->super_IGUIElement).Children.
                      super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar2 = *(int *)pcVar2 + 1;
      local_50.str._M_dataplus._M_p = (pointer)0x1e0000000a;
      local_50.str._M_string_length =
           CONCAT44(0x32,(*(int *)&this->field_0x38 - *(int *)&this->field_0x30) + -0x5a);
      pIVar14 = (IGUIEditBox *)
                (**(code **)(**(long **)&this->field_0x128 + 0xf8))
                          (*(long **)&this->field_0x128,0,&local_50,1,this,0xffffffff);
      this->FileNameText = pIVar14;
      (*(pIVar14->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])(pIVar14,1);
      pIVar14 = this->FileNameText;
      (pIVar14->super_IGUIElement).AlignLeft = EGUIA_UPPERLEFT;
      (pIVar14->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
      (pIVar14->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
      (pIVar14->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
      pcVar2 = (pIVar14->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] + 8 +
               (long)&(pIVar14->super_IGUIElement).Children.
                      super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
      ;
      *(int *)pcVar2 = *(int *)pcVar2 + 1;
      this->field_0x114 = 1;
      fillListBox(this);
    }
  }
  return;
}

Assistant:

CGUIFileOpenDialog::CGUIFileOpenDialog(const wchar_t *title,
		IGUIEnvironment *environment, IGUIElement *parent, s32 id,
		bool restoreCWD, io::path::char_type *startDir) :
		IGUIFileOpenDialog(environment, parent, id,
				core::rect<s32>((parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2,
						(parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2 + FOD_WIDTH,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2 + FOD_HEIGHT)),
		FileNameText(0), FileList(0), Dragging(false)
{
#ifdef _DEBUG
	IGUIElement::setDebugName("CGUIFileOpenDialog");
#endif

	Text = title;

	FileSystem = Environment ? Environment->getFileSystem() : 0;

	if (FileSystem) {
		FileSystem->grab();

		if (restoreCWD)
			RestoreDirectory = FileSystem->getWorkingDirectory();
		if (startDir) {
			StartDirectory = startDir;
			FileSystem->changeWorkingDirectoryTo(startDir);
		}
	} else
		return;

	IGUISpriteBank *sprites = 0;
	video::SColor color(255, 255, 255, 255);
	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		sprites = skin->getSpriteBank();
		color = skin->getColor(EGDC_WINDOW_SYMBOL);
	}

	const s32 buttonw = skin ? skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) : 2;
	const s32 posx = RelativeRect.getWidth() - buttonw - 4;

	CloseButton = Environment->addButton(core::rect<s32>(posx, 3, posx + buttonw, 3 + buttonw), this, -1,
			L"", skin ? skin->getDefaultText(EGDT_WINDOW_CLOSE) : L"Close");
	CloseButton->setSubElement(true);
	CloseButton->setTabStop(false);
	if (sprites && skin) {
		CloseButton->setSpriteBank(sprites);
		CloseButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_WINDOW_CLOSE), color);
		CloseButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_WINDOW_CLOSE), color);
	}
	CloseButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CloseButton->grab();

	OKButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 30, RelativeRect.getWidth() - 10, 50),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_OK) : L"OK");
	OKButton->setSubElement(true);
	OKButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	OKButton->grab();

	CancelButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 55, RelativeRect.getWidth() - 10, 75),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_CANCEL) : L"Cancel");
	CancelButton->setSubElement(true);
	CancelButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CancelButton->grab();

	FileBox = Environment->addListBox(core::rect<s32>(10, 55, RelativeRect.getWidth() - 90, 230), this, -1, true);
	FileBox->setSubElement(true);
	FileBox->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	FileBox->grab();

	FileNameText = Environment->addEditBox(0, core::rect<s32>(10, 30, RelativeRect.getWidth() - 90, 50), true, this);
	FileNameText->setSubElement(true);
	FileNameText->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	FileNameText->grab();

	setTabGroup(true);

	fillListBox();
}